

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

ssize_t __thiscall fmt::v5::file::read(file *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  size_t __buf_00;
  size_t __nbytes_00;
  int *piVar2;
  system_error *this_00;
  type tVar3;
  undefined4 in_register_00000034;
  bool bVar4;
  string_view local_38;
  long local_28;
  RWResult result;
  size_t count_local;
  void *buffer_local;
  file *this_local;
  
  count_local = CONCAT44(in_register_00000034,__fd);
  local_28 = 0;
  result = (RWResult)__buf;
  buffer_local = this;
  do {
    __buf_00 = count_local;
    iVar1 = this->fd_;
    __nbytes_00 = anon_unknown.dwarf_42229::convert_rwcount(result);
    local_28 = ::read(iVar1,(void *)__buf_00,__nbytes_00);
    bVar4 = false;
    if (local_28 == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  if (local_28 < 0) {
    this_00 = (system_error *)__cxa_allocate_exception(0x18);
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    basic_string_view<char>::basic_string_view(&local_38,"cannot read from file");
    system_error::system_error<>(this_00,iVar1,local_38);
    __cxa_throw(this_00,&system_error::typeinfo,system_error::~system_error);
  }
  tVar3 = internal::to_unsigned<long>(local_28);
  return tVar3;
}

Assistant:

std::size_t file::read(void *buffer, std::size_t count) {
  RWResult result = 0;
  FMT_RETRY(result, FMT_POSIX_CALL(read(fd_, buffer, convert_rwcount(count))));
  if (result < 0)
    FMT_THROW(system_error(errno, "cannot read from file"));
  return internal::to_unsigned(result);
}